

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::ICUTranscoder::transcodeTo
          (ICUTranscoder *this,XMLCh *srcData,XMLSize_t srcCount,XMLByte *toFill,XMLSize_t maxBytes,
          XMLSize_t *charsEaten,UnRepOpts options)

{
  XMLCh XVar1;
  MemoryManager *pMVar2;
  TranscodingException *this_00;
  XMLCh *text2;
  XMLSize_t XVar3;
  undefined8 in_stack_fffffffffffffeb8;
  uint uVar4;
  bool local_ea;
  code *local_e8;
  XMLCh local_c8 [4];
  XMLCh tmpBuf [17];
  UConverterFromUCallback orgAction;
  XMLCh *pXStack_90;
  bool res;
  UChar *startSrc;
  XMLByte *startTarget;
  undefined1 local_70 [8];
  void *orgContent;
  UConverterFromUCallback oldCB;
  undefined1 local_58 [4];
  UErrorCode err;
  ArrayJanitor<char16_t> janTmpBuf;
  UChar *tmpBufPtr;
  UChar *srcPtr;
  XMLSize_t *charsEaten_local;
  XMLSize_t maxBytes_local;
  XMLByte *toFill_local;
  XMLSize_t srcCount_local;
  XMLCh *srcData_local;
  ICUTranscoder *this_local;
  
  uVar4 = (uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  janTmpBuf.fMemoryManager = (MemoryManager *)0x0;
  pMVar2 = XMLTranscoder::getMemoryManager(&this->super_XMLTranscoder);
  ArrayJanitor<char16_t>::ArrayJanitor((ArrayJanitor<char16_t> *)local_58,(char16_t *)0x0,pMVar2);
  oldCB._4_4_ = 0;
  orgContent = (void *)0x0;
  if (options == UnRep_Throw) {
    local_e8 = UCNV_FROM_U_CALLBACK_STOP_70;
  }
  else {
    local_e8 = UCNV_FROM_U_CALLBACK_SUBSTITUTE_70;
  }
  ucnv_setFromUCallBack_70(this->fConverter,local_e8,0,&orgContent,local_70,(long)&oldCB + 4);
  oldCB._4_4_ = 0;
  pXStack_90 = srcData;
  startSrc = (UChar *)toFill;
  ucnv_fromUnicode_70(this->fConverter,&startSrc,toFill + maxBytes,&stack0xffffffffffffff70,
                      srcData + srcCount,0,(ulong)uVar4 << 0x20,(long)&oldCB + 4);
  local_ea = true;
  if (oldCB._4_4_ != 0) {
    local_ea = oldCB._4_4_ == 0xf && srcData < pXStack_90;
  }
  oldCB._4_4_ = 0;
  stack0xffffffffffffff60 = 0;
  ucnv_setFromUCallBack_70(this->fConverter,orgContent,0,tmpBuf + 0x10,local_70,(long)&oldCB + 4);
  if (!local_ea) {
    XVar1 = *pXStack_90;
    pMVar2 = XMLTranscoder::getMemoryManager(&this->super_XMLTranscoder);
    XMLString::binToText((uint)(ushort)XVar1,local_c8,0x10,0x10,pMVar2);
    this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
    text2 = XMLTranscoder::getEncodingName(&this->super_XMLTranscoder);
    pMVar2 = XMLTranscoder::getMemoryManager(&this->super_XMLTranscoder);
    TranscodingException::TranscodingException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/Transcoders/ICU/ICUTransService.cpp"
               ,0x2b2,Trans_Unrepresentable,local_c8,text2,(XMLCh *)0x0,(XMLCh *)0x0,pMVar2);
    __cxa_throw(this_00,&TranscodingException::typeinfo,TranscodingException::~TranscodingException)
    ;
  }
  *charsEaten = (long)pXStack_90 - (long)srcData >> 1;
  XVar3 = (long)startSrc - (long)toFill;
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_58);
  return XVar3;
}

Assistant:

XMLSize_t
ICUTranscoder::transcodeTo( const   XMLCh* const    srcData
                            , const XMLSize_t       srcCount
                            ,       XMLByte* const  toFill
                            , const XMLSize_t       maxBytes
                            ,       XMLSize_t&      charsEaten
                            , const UnRepOpts       options)
{
    //
    //  Get a pointer to the buffer to transcode. If UChar and XMLCh are
    //  the same size here, then use the original. Else, create a temp
    //  one and put a janitor on it.
    //
    const UChar* srcPtr;
    UChar* tmpBufPtr = 0;
    if (sizeof(XMLCh) == sizeof(UChar))
    {
        srcPtr = (const UChar*)srcData;
    }
    else
    {
        tmpBufPtr = convertToUChar(srcData, srcCount, getMemoryManager());
        srcPtr = tmpBufPtr;
    }
    ArrayJanitor<UChar> janTmpBuf(tmpBufPtr, getMemoryManager());

    //
    //  Set the appropriate callback so that it will either fail or use
    //  the rep char. Remember the old one so we can put it back.
    //
    UErrorCode  err = U_ZERO_ERROR;
    UConverterFromUCallback oldCB = NULL;
    #if (U_ICU_VERSION_MAJOR_NUM < 2)
    void* orgContent;
    #else
    const void* orgContent;
    #endif
    ucnv_setFromUCallBack
    (
        fConverter
        , (options == UnRep_Throw) ? UCNV_FROM_U_CALLBACK_STOP
                                   : UCNV_FROM_U_CALLBACK_SUBSTITUTE
        , NULL
        , &oldCB
        , &orgContent
        , &err
    );

    //
    //  Ok, lets transcode as many chars as we we can in one shot. The
    //  ICU API gives enough info not to have to do this one char by char.
    //
    XMLByte*        startTarget = toFill;
    const UChar*    startSrc = srcPtr;
    err = U_ZERO_ERROR;
    ucnv_fromUnicode
    (
        fConverter
        , (char**)&startTarget
        , (char*)(startTarget + maxBytes)
        , &startSrc
        , srcPtr + srcCount
        , 0
        , false
        , &err
    );

    // Rememember the status before we possibly overite the error code
    const bool res = ((err == U_ZERO_ERROR) || (err == U_BUFFER_OVERFLOW_ERROR && startSrc > srcPtr));

    // Put the old handler back
    err = U_ZERO_ERROR;
    UConverterFromUCallback orgAction = NULL;

    ucnv_setFromUCallBack(fConverter, oldCB, NULL, &orgAction, &orgContent, &err);

    if (!res)
    {
        XMLCh tmpBuf[17];
        XMLString::binToText((unsigned int)*startSrc, tmpBuf, 16, 16, getMemoryManager());
        ThrowXMLwithMemMgr2
        (
            TranscodingException
            , XMLExcepts::Trans_Unrepresentable
            , tmpBuf
            , getEncodingName()
            , getMemoryManager()
        );
    }

    // Fill in the chars we ate from the input
    charsEaten = startSrc - srcPtr;

    // Return the chars we stored
    return startTarget - toFill;
}